

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

msgpack_unpack_return
msgpack_unpack(char *data,size_t len,size_t *off,msgpack_zone *result_zone,msgpack_object *result)

{
  msgpack_unpack_return mVar1;
  size_t noff;
  template_context ctx;
  
  noff = 0;
  mVar1 = MSGPACK_UNPACK_CONTINUE;
  if (off != (size_t *)0x0) {
    noff = *off;
  }
  if (noff < len) {
    ctx.cs = 0;
    ctx.trail = 0;
    ctx.top = 0;
    ctx.stack[0].obj.type = MSGPACK_OBJECT_NIL;
    ctx.user.referenced = false;
    ctx.user.z = result_zone;
    mVar1 = template_execute(&ctx,data,len,&noff);
    if (MSGPACK_UNPACK_PARSE_ERROR < mVar1) {
      if (off != (size_t *)0x0) {
        *off = noff;
      }
      if (mVar1 == MSGPACK_UNPACK_CONTINUE) {
        mVar1 = MSGPACK_UNPACK_CONTINUE;
      }
      else {
        (result->via).array.ptr = ctx.stack[0].obj.via.array.ptr;
        *(ulong *)result = CONCAT44(ctx.stack[0].obj._4_4_,ctx.stack[0].obj.type);
        (result->via).u64 = ctx.stack[0].obj.via.u64;
        mVar1 = MSGPACK_UNPACK_SUCCESS - (uint)(noff < len);
      }
    }
  }
  return mVar1;
}

Assistant:

msgpack_unpack_return
msgpack_unpack(const char* data, size_t len, size_t* off,
        msgpack_zone* result_zone, msgpack_object* result)
{
    size_t noff = 0;
    if(off != NULL) { noff = *off; }

    if(len <= noff) {
        // FIXME
        return MSGPACK_UNPACK_CONTINUE;
    }
    else {
        int e;
        template_context ctx;
        template_init(&ctx);

        ctx.user.z = result_zone;
        ctx.user.referenced = false;

        e = template_execute(&ctx, data, len, &noff);
        if(e < 0) {
            return e;
        }

        if(off != NULL) { *off = noff; }

        if(e == 0) {
            return MSGPACK_UNPACK_CONTINUE;
        }

        *result = template_data(&ctx);

        if(noff < len) {
            return MSGPACK_UNPACK_EXTRA_BYTES;
        }

        return MSGPACK_UNPACK_SUCCESS;
    }
}